

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2D.cpp
# Opt level: O0

void __thiscall
EnvironmentNAV2D::GetPredsofChangedEdges
          (EnvironmentNAV2D *this,
          vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *changedcellsV,
          vector<int,_std::allocator<int>_> *preds_of_changededgesIDV)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *in_RSI;
  long *in_RDI;
  int affy;
  int affx;
  int i;
  int aind;
  sbpl_2Dcell_t cell;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  int local_28;
  int local_24;
  value_type local_20;
  vector<int,_std::allocator<int>_> *local_18;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sbpl_2Dcell_t::sbpl_2Dcell_t(&local_20);
  for (local_28 = 0;
      sVar3 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::size(local_10),
      local_28 < (int)sVar3; local_28 = local_28 + 1) {
    pvVar4 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                       ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)
                        in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    local_20 = *pvVar4;
    in_stack_ffffffffffffffb0 = local_18;
    (**(code **)(*in_RDI + 0x140))(in_RDI,(ulong)local_20 & 0xffffffff,local_20.y);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffb0,(value_type_conflict1 *)in_stack_ffffffffffffffa8);
    for (local_24 = 0; local_24 < *(int *)((long)in_RDI + 0x20c); local_24 = local_24 + 1) {
      iVar1 = local_20.x + *(int *)((long)in_RDI + (long)local_24 * 4 + 0x4c);
      iVar2 = local_20.y + *(int *)((long)in_RDI + (long)local_24 * 4 + 0x8c);
      if ((((-1 < iVar1) && (iVar1 < (int)in_RDI[5])) && (-1 < iVar2)) &&
         (iVar2 < *(int *)((long)in_RDI + 0x2c))) {
        in_stack_ffffffffffffffa8 = local_18;
        (**(code **)(*in_RDI + 0x140))(in_RDI,iVar1,iVar2);
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_ffffffffffffffb0,(value_type_conflict1 *)in_stack_ffffffffffffffa8);
      }
    }
  }
  return;
}

Assistant:

void EnvironmentNAV2D::GetPredsofChangedEdges(vector<nav2dcell_t> const * changedcellsV,
                                              vector<int> *preds_of_changededgesIDV)
{
    nav2dcell_t cell;
    int aind;

    for (int i = 0; i < (int)changedcellsV->size(); i++) {
        cell = changedcellsV->at(i);
        preds_of_changededgesIDV->push_back(GetStateFromCoord(cell.x, cell.y));

        for (aind = 0; aind < EnvNAV2DCfg.numofdirs; aind++) {
            //the actions are undirected, so we can use the same array of actions as in getsuccs case
            int affx = cell.x + EnvNAV2DCfg.dx_[aind];
            int affy = cell.y + EnvNAV2DCfg.dy_[aind];
            if (affx < 0 || affx >= EnvNAV2DCfg.EnvWidth_c || affy < 0 || affy >= EnvNAV2DCfg.EnvHeight_c) continue;
            preds_of_changededgesIDV->push_back(GetStateFromCoord(affx, affy));
        }
    }
}